

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

string * __thiscall
iDynTree::Model::getJointName_abi_cxx11_
          (string *__return_storage_ptr__,Model *this,JointIndex jointIndex)

{
  pointer pbVar1;
  pointer pcVar2;
  ostream *poVar3;
  stringstream ss;
  long *local_1c8;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  if ((jointIndex < 0) ||
     ((long)(this->joints).
            super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->joints).
            super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= jointIndex)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_198,"jointIndex ",0xb);
    poVar3 = std::ostream::_M_insert<long>((long)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," is not valid, should be between 0 and ",0x27);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("Model","getJointName",(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,JOINT_INVALID_NAME_abi_cxx11_,
               DAT_00187d40 + JOINT_INVALID_NAME_abi_cxx11_);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  else {
    pbVar1 = (this->jointNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = pbVar1[jointIndex]._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1[jointIndex]._M_string_length)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Model::getJointName(const JointIndex jointIndex) const
{
    if( jointIndex >= 0 && jointIndex < (JointIndex)this->getNrOfJoints() )
    {
        return jointNames[jointIndex];
    }
    else
    {
        std::stringstream ss;
        ss << "jointIndex " << jointIndex << " is not valid, should be between 0 and " << this->getNrOfJoints()-1;
        reportError("Model","getJointName",ss.str().c_str());
        return JOINT_INVALID_NAME;
    }
}